

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Clara::CommandLine<Catch::ConfigData>::Arg::validate(Arg *this)

{
  logic_error *this_00;
  bool bVar1;
  char *in_RDI;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffac;
  Arg *in_stack_ffffffffffffffc8;
  string local_28 [40];
  
  bVar1 = Detail::BoundArgFunction<Catch::ConfigData>::takesArg
                    ((BoundArgFunction<Catch::ConfigData> *)0x193018);
  if ((bVar1) && (bVar1 = takesArg((Arg *)0x19302b), !bVar1)) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffa8);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    dbgName_abi_cxx11_(in_stack_ffffffffffffffc8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffffac,uVar2),in_RDI);
    std::logic_error::logic_error(this_00,local_28);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void validate() const {
                if( boundField.takesArg() && !takesArg() )
                    throw std::logic_error( dbgName() + " must specify an arg name" );
            }